

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.h
# Opt level: O2

void __thiscall BailOutInfo::BailOutInfo(BailOutInfo *this,uint32 bailOutOffset,Func *bailOutFunc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  CapturedValues *pCVar4;
  
  this->wasCloned = false;
  this->isInvertedBranch = false;
  this->canDeadStore = true;
  this->sharedBailOutKind = true;
  this->isLoopTopBailOutInfo = false;
  this->clearedDstByteCodeUpwardExposedUseId = 0xffffffff;
  this->bailOutOffset = bailOutOffset;
  this->bailOutRecord = (BailOutRecord *)0x0;
  this->byteCodeUpwardExposedUsed = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->polymorphicCacheIndex = 0xffffffff;
  this->startCallCount = 0;
  this->totalOutParamCount = 0;
  this->stackLiteralBailOutInfoCount = 0;
  this->startCallInfo = (StartCallInfo *)0x0;
  this->argOutSyms = (StackSym **)0x0;
  this->stackLiteralBailOutInfo = (StackLiteralBailOutInfo *)0x0;
  this->liveVarSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->liveLosslessInt32Syms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->liveFloat64Syms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->outParamInlinedArgSlot = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->bailOutInstr = (Instr *)0x0;
  this->bailInInstr = (GeneratorBailInInstr *)0x0;
  this->bailOutFunc = bailOutFunc;
  this->branchConditionOpnd = (Opnd *)0x0;
  if (bailOutOffset == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.h"
                       ,0x24,"(bailOutOffset != Js::Constants::NoByteCodeOffset)",
                       "bailOutOffset != Js::Constants::NoByteCodeOffset");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->wasCopied = false;
  pCVar4 = (CapturedValues *)new<Memory::JitArenaAllocator>(0x30,bailOutFunc->m_alloc,0x3d6ef4);
  (pCVar4->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pCVar4;
  (pCVar4->constantValues).super_RealCount.count = 0;
  (pCVar4->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &(pCVar4->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>;
  (pCVar4->copyPropSyms).super_RealCount.count = 0;
  pCVar4->argObjSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->capturedValues = pCVar4;
  pCVar4->refCount = 1;
  pCVar4 = (CapturedValues *)new<Memory::JitArenaAllocator>(0x30,bailOutFunc->m_alloc,0x3d6ef4);
  (pCVar4->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pCVar4;
  (pCVar4->constantValues).super_RealCount.count = 0;
  (pCVar4->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &(pCVar4->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>;
  (pCVar4->copyPropSyms).super_RealCount.count = 0;
  pCVar4->refCount = 0;
  this->usedCapturedValues = pCVar4;
  pCVar4->argObjSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  return;
}

Assistant:

BailOutInfo(uint32 bailOutOffset, Func* bailOutFunc) :
        bailOutOffset(bailOutOffset), bailOutFunc(bailOutFunc),
        byteCodeUpwardExposedUsed(nullptr), polymorphicCacheIndex((uint)-1), startCallCount(0), startCallInfo(nullptr), bailOutInstr(nullptr), bailInInstr(nullptr),
        totalOutParamCount(0), argOutSyms(nullptr), bailOutRecord(nullptr), wasCloned(false), isInvertedBranch(false), sharedBailOutKind(true), isLoopTopBailOutInfo(false), canDeadStore(true),
        outParamInlinedArgSlot(nullptr), liveVarSyms(nullptr), liveLosslessInt32Syms(nullptr), liveFloat64Syms(nullptr),
        branchConditionOpnd(nullptr),
        stackLiteralBailOutInfoCount(0), stackLiteralBailOutInfo(nullptr),
        clearedDstByteCodeUpwardExposedUseId(SymID_Invalid)
    {
        Assert(bailOutOffset != Js::Constants::NoByteCodeOffset);
#ifdef _M_IX86
        outParamFrameAdjustArgSlot = nullptr;
#endif
#if DBG
        wasCopied = false;
#endif
        this->capturedValues = JitAnew(bailOutFunc->m_alloc, CapturedValues);
        this->capturedValues->refCount = 1;

        this->usedCapturedValues = JitAnew(bailOutFunc->m_alloc, CapturedValues);
        this->usedCapturedValues->argObjSyms = nullptr;
    }